

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resDivs.c
# Opt level: O0

int Res_WinVisitMffc(Abc_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  int Count2;
  int Count1;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsNode(pNode);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resDivs.c"
                  ,0x113,"int Res_WinVisitMffc(Abc_Obj_t *)");
  }
  iVar1 = Res_NodeDeref_rec(pNode);
  iVar2 = Res_NodeRef_rec(pNode);
  if (iVar1 == iVar2) {
    return iVar1;
  }
  __assert_fail("Count1 == Count2",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resDivs.c"
                ,0x118,"int Res_WinVisitMffc(Abc_Obj_t *)");
}

Assistant:

int Res_WinVisitMffc( Abc_Obj_t * pNode )
{
    int Count1, Count2;
    assert( Abc_ObjIsNode(pNode) );
    // dereference the node (mark with the current trav ID)
    Count1 = Res_NodeDeref_rec( pNode );
    // reference it back
    Count2 = Res_NodeRef_rec( pNode );
    assert( Count1 == Count2 );
    return Count1;
}